

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_quad_read_lane_at_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  Value *value;
  Operation *pOVar5;
  Operation *add_op;
  Operation *mask_op;
  Operation *load_op;
  Operation *pOStack_38;
  Id local_id;
  Operation *op;
  Value *lane;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  if (((impl->execution_mode_meta).synthesize_dummy_derivatives & 1U) == 0) {
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    bVar1 = execution_model_can_quad_op(impl->execution_model);
    if ((bVar1) && (bVar1 = LLVMBC::isa<LLVMBC::ConstantInt>(pVVar4), bVar1)) {
      pOStack_38 = Converter::Impl::allocate
                             (impl,OpGroupNonUniformQuadBroadcast,(Value *)instruction);
      IVar2 = spv::Builder::makeUintConstant(this,3,false);
      Operation::add_id(pOStack_38,IVar2);
      value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar2 = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(pOStack_38,IVar2);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      Operation::add_id(pOStack_38,IVar2);
      spv::Builder::addCapability(this,CapabilityGroupNonUniformQuad);
    }
    else {
      IVar2 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,BuiltInSubgroupLocalInvocationId);
      IVar3 = spv::Builder::makeUintType(this,0x20);
      pOVar5 = Converter::Impl::allocate(impl,OpLoad,IVar3);
      Operation::add_id(pOVar5,IVar2);
      Converter::Impl::add(impl,pOVar5,false);
      IVar2 = pOVar5->id;
      IVar3 = spv::Builder::makeUintType(this,0x20);
      pOVar5 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar3);
      Operation::add_id(pOVar5,IVar2);
      IVar2 = spv::Builder::makeUintConstant(this,0xfffffffc,false);
      Operation::add_id(pOVar5,IVar2);
      Converter::Impl::add(impl,pOVar5,false);
      IVar2 = pOVar5->id;
      IVar3 = spv::Builder::makeUintType(this,0x20);
      pOVar5 = Converter::Impl::allocate(impl,OpIAdd,IVar3);
      Operation::add_id(pOVar5,IVar2);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      Operation::add_id(pOVar5,IVar2);
      Converter::Impl::add(impl,pOVar5,false);
      IVar2 = pOVar5->id;
      pOStack_38 = Converter::Impl::allocate(impl,OpGroupNonUniformShuffle,(Value *)instruction);
      IVar3 = spv::Builder::makeUintConstant(this,3,false);
      Operation::add_id(pOStack_38,IVar3);
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      Operation::add_id(pOStack_38,IVar3);
      Operation::add_id(pOStack_38,IVar2);
      spv::Builder::addCapability(this,CapabilityGroupNonUniformShuffle);
      Converter::Impl::suggest_maximum_wave_size(impl,0x20);
    }
    (impl->shader_analysis).require_subgroup_shuffles = true;
    Converter::Impl::add(impl,pOStack_38,false);
  }
  else {
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar2);
  }
  return true;
}

Assistant:

bool emit_wave_quad_read_lane_at_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		impl.rewrite_value(instruction, impl.get_id_for_value(instruction->getOperand(1)));
		return true;
	}

	auto *lane = instruction->getOperand(2);

	Operation *op;
	if (execution_model_can_quad_op(impl.execution_model) && llvm::isa<llvm::ConstantInt>(lane))
	{
		op = impl.allocate(spv::OpGroupNonUniformQuadBroadcast, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		op->add_id(impl.get_id_for_value(lane));
		builder.addCapability(spv::CapabilityGroupNonUniformQuad);
	}
	else
	{
		// Have to emulate this with Shuffle.
		spv::Id local_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSubgroupLocalInvocationId);
		{
			Operation *load_op = impl.allocate(spv::OpLoad, builder.makeUintType(32));
			load_op->add_id(local_id);
			impl.add(load_op);
			local_id = load_op->id;
		}

		{
			Operation *mask_op = impl.allocate(spv::OpBitwiseAnd, builder.makeUintType(32));
			mask_op->add_id(local_id);
			mask_op->add_id(builder.makeUintConstant(~3u));
			impl.add(mask_op);
			local_id = mask_op->id;
		}

		{
			Operation *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
			add_op->add_id(local_id);
			add_op->add_id(impl.get_id_for_value(lane));
			impl.add(add_op);
			local_id = add_op->id;
		}

		// Use Shuffle for non-fragment stages.
		op = impl.allocate(spv::OpGroupNonUniformShuffle, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		op->add_id(local_id);

		builder.addCapability(spv::CapabilityGroupNonUniformShuffle);

		// For shuffle, wave64 is particularly slow on RDNA, so suggest wave32.
		impl.suggest_maximum_wave_size(32);
	}

	impl.shader_analysis.require_subgroup_shuffles = true;

	impl.add(op);
	return true;
}